

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# truc_policy.cpp
# Opt level: O3

optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
* SingleTRUCChecks_abi_cxx11_
            (optional<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
             *__return_storage_ptr__,CTransactionRef *ptx,setEntries *mempool_ancestors,
            set<transaction_identifier<false>,_std::less<transaction_identifier<false>_>,_std::allocator<transaction_identifier<false>_>_>
            *direct_conflicts,int64_t vsize)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint32_t uVar3;
  _Base_ptr p_Var4;
  element_type *peVar5;
  size_t sVar6;
  long lVar7;
  long *plVar8;
  size_type sVar9;
  bool bVar10;
  _Base_ptr p_Var11;
  undefined8 uVar12;
  long *plVar13;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var14;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var16;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  undefined1 local_110 [16];
  undefined1 local_100 [16];
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  string local_d8;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  peVar5 = (ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  uVar3 = peVar5->version;
  p_Var4 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  args_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)vsize;
  local_110._0_8_ = vsize;
  for (p_Var11 = p_Var4;
      (_Rb_tree_header *)p_Var11 != &(mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header;
      p_Var11 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var11)) {
    if (uVar3 == 3) {
      if (*(int *)(**(long **)(p_Var11 + 1) + 0x30) != 3) {
        base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar5->hash);
        base_blob<256u>::ToString_abi_cxx11_
                  (&local_98,
                   &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                    _M_ptr)->m_witness_hash);
        lVar7 = **(long **)(p_Var11 + 1);
        p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var11 + 1))[1];
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          }
        }
        base_blob<256u>::ToString_abi_cxx11_(&local_b8,(void *)(lVar7 + 0x39));
        lVar7 = **(long **)(p_Var11 + 1);
        p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var11 + 1))[1];
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          }
        }
        base_blob<256u>::ToString_abi_cxx11_(&local_d8,(void *)(lVar7 + 0x59));
        tinyformat::
        format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                  (&local_58,
                   (tinyformat *)
                   "version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                   (char *)&local_78,&local_98,&local_b8,&local_d8,in_stack_fffffffffffffec8);
LAB_00484814:
        sVar9 = local_58._M_string_length;
        local_110._8_8_ = local_100 + 8;
        paVar2 = &local_58.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p == paVar2) {
          uStack_f0 = local_58.field_2._8_8_;
          local_58._M_dataplus._M_p = (pointer)local_110._8_8_;
        }
        local_100._9_7_ = local_58.field_2._M_allocated_capacity._1_7_;
        local_100[8] = local_58.field_2._M_local_buf[0];
        local_58._M_string_length = 0;
        local_58.field_2._M_local_buf[0] = '\0';
        local_e8 = 0;
        paVar1 = &(__return_storage_ptr__->
                  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                  ._M_payload._M_value.first.field_2;
        *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          **)&(__return_storage_ptr__->
              super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
              )._M_payload.
              super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
              .
              super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
              ._M_payload = paVar1;
        if (local_58._M_dataplus._M_p == (pointer)local_110._8_8_) {
          paVar1->_M_allocated_capacity = local_100._8_8_;
          *(undefined8 *)
           ((long)&(__return_storage_ptr__->
                   super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                   ._M_payload._M_value.first.field_2 + 8) = uStack_f0;
        }
        else {
          (__return_storage_ptr__->
          super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
          ._M_payload._M_value.first._M_dataplus = (_Alloc_hider)local_58._M_dataplus._M_p;
          (__return_storage_ptr__->
          super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
          ._M_payload._M_value.first.field_2._M_allocated_capacity = local_100._8_8_;
        }
        (__return_storage_ptr__->
        super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
        ._M_payload._M_value.first._M_string_length = sVar9;
        local_100._0_8_ = 0;
        local_100._8_8_ = (ulong)(uint7)local_58.field_2._M_allocated_capacity._1_7_ << 8;
        (__return_storage_ptr__->
        super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
        ._M_payload._M_value.second.
        super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
        ((long)&(__return_storage_ptr__->
                super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                ._M_payload._M_value.second.
                super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        (__return_storage_ptr__->
        super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
        ._M_engaged = true;
        local_58._M_dataplus._M_p = (pointer)paVar2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
          operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
        }
        if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
          operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        }
        if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
        }
        goto LAB_0048490f;
      }
    }
    else if (*(int *)(**(long **)(p_Var11 + 1) + 0x30) == 3) {
      base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar5->hash);
      base_blob<256u>::ToString_abi_cxx11_
                (&local_98,
                 &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->m_witness_hash);
      lVar7 = **(long **)(p_Var11 + 1);
      p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var11 + 1))[1];
      if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
        }
      }
      base_blob<256u>::ToString_abi_cxx11_(&local_b8,(void *)(lVar7 + 0x39));
      lVar7 = **(long **)(p_Var11 + 1);
      p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var11 + 1))[1];
      if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
        }
      }
      base_blob<256u>::ToString_abi_cxx11_(&local_d8,(void *)(lVar7 + 0x59));
      tinyformat::
      format<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>
                (&local_58,
                 (tinyformat *)
                 "non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                 (char *)&local_78,&local_98,&local_b8,&local_d8,in_stack_fffffffffffffec8);
      goto LAB_00484814;
    }
  }
  if (uVar3 != 3) goto LAB_004849b1;
  if (vsize < 0x2711) {
    sVar6 = (mempool_ancestors->_M_t)._M_impl.super__Rb_tree_header._M_node_count;
    if (0xfffffffffffffffc < sVar6 - 2) {
      if (sVar6 != 0) {
        if (1000 < vsize) {
          base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar5->hash);
          base_blob<256u>::ToString_abi_cxx11_
                    (&local_98,
                     &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                      _M_ptr)->m_witness_hash);
          tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
                    (&local_58,
                     (tinyformat *)
                     "version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                     (char *)&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
                     &TRUC_CHILD_MAX_VSIZE,(long *)in_stack_fffffffffffffec8);
          goto LAB_00484670;
        }
        plVar8 = *(long **)(p_Var4 + 1);
        if (plVar8[0xd] == 0) {
          bVar10 = false;
          plVar13 = plVar8;
        }
        else {
          bVar10 = std::
                   any_of<std::_Rb_tree_const_iterator<std::reference_wrapper<CTxMemPoolEntry_const>>,SingleTRUCChecks[abi:cxx11](std::shared_ptr<CTransaction_const>const&,std::set<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>,CompareIteratorByHash,std::allocator<boost::multi_index::detail::hashed_index_iterator<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::hashed_index_node<boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,boost::multi_index::detail::index_node_base<CTxMemPoolEntry,std::allocator<CTxMemPoolEntry>>>>>>>,boost::multi_index::detail::bucket_array<std::allocator<CTxMemPoolEntry>>,boost::multi_index::detail::hashed_unique_tag,boost::multi_index::detail::hashed_index_global_iterator_tag>>>const&,std::set<transaction_identifier<false>,std::less<transaction_identifier<false>>,std::allocator<transaction_identifier<false>>>const&,long)::__0>
                             ((_Base_ptr)plVar8[0xb],(_Base_ptr)(plVar8 + 9),
                              (anon_class_8_1_b4982c89_for__M_pred)direct_conflicts);
          plVar13 = *(long **)(p_Var4 + 1);
        }
        if ((bVar10 == false) && (2 < plVar13[0x19] + 1U)) {
          if (plVar13[0x19] == 2) {
            bVar10 = *(long *)(*(long *)(plVar8[0xb] + 0x20) + 0xe0) == 2;
          }
          else {
            bVar10 = false;
          }
          lVar7 = *plVar13;
          p_Var15 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar13[1];
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var15->_M_use_count = p_Var15->_M_use_count + 1;
            }
          }
          base_blob<256u>::ToString_abi_cxx11_(&local_78,(void *)(lVar7 + 0x39));
          lVar7 = **(long **)(p_Var4 + 1);
          p_Var16 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(*(long **)(p_Var4 + 1))[1];
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var16->_M_use_count = p_Var16->_M_use_count + 1;
            }
          }
          base_blob<256u>::ToString_abi_cxx11_(&local_98,(void *)(lVar7 + 0x59));
          tinyformat::format<std::__cxx11::string,std::__cxx11::string>
                    (&local_58,(tinyformat *)"tx %u (wtxid=%s) would exceed descendant count limit",
                     (char *)&local_78,&local_98,args_1);
          sVar9 = local_58._M_string_length;
          if (bVar10) {
            uVar12 = **(undefined8 **)(plVar8[0xb] + 0x20);
            p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      (*(undefined8 **)(plVar8[0xb] + 0x20))[1];
            if (p_Var14 == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            }
            else if (__libc_single_threaded == '\0') {
              LOCK();
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
              UNLOCK();
            }
            else {
              p_Var14->_M_use_count = p_Var14->_M_use_count + 1;
            }
          }
          else {
            uVar12 = 0;
            p_Var14 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          }
          local_110._8_8_ = local_100 + 8;
          paVar2 = &local_58.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p == paVar2) {
            uStack_f0 = local_58.field_2._8_8_;
            local_58._M_dataplus._M_p = (pointer)local_110._8_8_;
          }
          local_100._9_7_ = local_58.field_2._M_allocated_capacity._1_7_;
          local_100[8] = local_58.field_2._M_local_buf[0];
          local_58._M_string_length = 0;
          local_58.field_2._M_local_buf[0] = '\0';
          paVar1 = &(__return_storage_ptr__->
                    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                    )._M_payload.
                    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                    ._M_payload._M_value.first.field_2;
          *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            **)&(__return_storage_ptr__->
                super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                )._M_payload.
                super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                .
                super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                ._M_payload = paVar1;
          if (local_58._M_dataplus._M_p == (pointer)local_110._8_8_) {
            paVar1->_M_allocated_capacity = local_100._8_8_;
            *(undefined8 *)
             ((long)&(__return_storage_ptr__->
                     super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                     )._M_payload.
                     super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                     .
                     super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                     ._M_payload._M_value.first.field_2 + 8) = uStack_f0;
          }
          else {
            (__return_storage_ptr__->
            super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
            ._M_payload._M_value.first._M_dataplus = (_Alloc_hider)local_58._M_dataplus._M_p;
            (__return_storage_ptr__->
            super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
            ._M_payload._M_value.first.field_2._M_allocated_capacity = local_100._8_8_;
          }
          (__return_storage_ptr__->
          super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
          ._M_payload._M_value.first._M_string_length = sVar9;
          local_100._0_8_ = 0;
          local_100._8_8_ = (ulong)(uint7)local_58.field_2._M_allocated_capacity._1_7_ << 8;
          (__return_storage_ptr__->
          super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
          ._M_payload._M_value.second.
          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)uVar12;
          local_e0 = 0;
          ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
          ((long)&(__return_storage_ptr__->
                  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
                  )._M_payload.
                  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
                  ._M_payload._M_value.second.
                  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
               p_Var14;
          local_e8 = 0;
          (__return_storage_ptr__->
          super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
          ._M_engaged = true;
          local_58._M_dataplus._M_p = (pointer)paVar2;
          std::
          pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
          ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>
                   *)(local_110 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != paVar2) {
            operator_delete(local_58._M_dataplus._M_p,
                            CONCAT71(local_58.field_2._M_allocated_capacity._1_7_,
                                     local_58.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_98._M_dataplus._M_p != &local_98.field_2) {
            operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
          }
          if (p_Var16 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var16);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
          }
          if (p_Var15 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var15);
          }
          goto LAB_004849bc;
        }
      }
LAB_004849b1:
      (__return_storage_ptr__->
      super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
      ._M_engaged = false;
      goto LAB_004849bc;
    }
    base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar5->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_98,
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string>
              (&local_58,(tinyformat *)"tx %s (wtxid=%s) would have too many ancestors",
               (char *)&local_78,&local_98,args_1);
  }
  else {
    base_blob<256u>::ToString_abi_cxx11_(&local_78,&peVar5->hash);
    base_blob<256u>::ToString_abi_cxx11_
              (&local_98,
               &((ptx->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
                m_witness_hash);
    tinyformat::format<std::__cxx11::string,std::__cxx11::string,long,long>
              (&local_58,
               (tinyformat *)"version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
               (char *)&local_78,&local_98,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_110,
               &TRUC_MAX_VSIZE,(long *)in_stack_fffffffffffffec8);
  }
LAB_00484670:
  sVar9 = local_58._M_string_length;
  local_110._8_8_ = local_100 + 8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p == &local_58.field_2) {
    uStack_f0 = local_58.field_2._8_8_;
    local_58._M_dataplus._M_p = (pointer)local_110._8_8_;
  }
  local_100._9_7_ = local_58.field_2._M_allocated_capacity._1_7_;
  local_100[8] = local_58.field_2._M_local_buf[0];
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_e8 = 0;
  paVar2 = &(__return_storage_ptr__->
            super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
            )._M_payload.
            super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
            .
            super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
            ._M_payload._M_value.first.field_2;
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)&(__return_storage_ptr__->
        super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
        ._M_payload = paVar2;
  if (local_58._M_dataplus._M_p == (pointer)local_110._8_8_) {
    paVar2->_M_allocated_capacity = local_100._8_8_;
    *(undefined8 *)
     ((long)&(__return_storage_ptr__->
             super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
             )._M_payload.
             super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
             .
             super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
             ._M_payload._M_value.first.field_2 + 8) = uStack_f0;
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
    ._M_payload._M_value.first._M_dataplus = (_Alloc_hider)local_58._M_dataplus._M_p;
    (__return_storage_ptr__->
    super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
    ._M_payload._M_value.first.field_2._M_allocated_capacity = local_100._8_8_;
  }
  (__return_storage_ptr__->
  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
  ._M_payload._M_value.first._M_string_length = sVar9;
  local_100._0_8_ = 0;
  local_100._8_8_ = (ulong)(uint7)local_58.field_2._M_allocated_capacity._1_7_ << 8;
  (__return_storage_ptr__->
  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
  ._M_payload._M_value.second.super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
  ((long)&(__return_storage_ptr__->
          super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
          )._M_payload.
          super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
          ._M_payload._M_value.second.
          super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2> + 8))->_M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (__return_storage_ptr__->
  super__Optional_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_false,_false>
  )._M_payload.
  super__Optional_payload<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>,_true,_false,_false>
  .
  super__Optional_payload_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<const_CTransaction>_>_>
  ._M_engaged = true;
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
LAB_0048490f:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
LAB_004849bc:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

std::optional<std::pair<std::string, CTransactionRef>> SingleTRUCChecks(const CTransactionRef& ptx,
                                          const CTxMemPool::setEntries& mempool_ancestors,
                                          const std::set<Txid>& direct_conflicts,
                                          int64_t vsize)
{
    // Check TRUC and non-TRUC inheritance.
    for (const auto& entry : mempool_ancestors) {
        if (ptx->version != TRUC_VERSION && entry->GetTx().version == TRUC_VERSION) {
            return std::make_pair(strprintf("non-version=3 tx %s (wtxid=%s) cannot spend from version=3 tx %s (wtxid=%s)",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                             entry->GetSharedTx()->GetHash().ToString(), entry->GetSharedTx()->GetWitnessHash().ToString()),
                nullptr);
        } else if (ptx->version == TRUC_VERSION && entry->GetTx().version != TRUC_VERSION) {
            return std::make_pair(strprintf("version=3 tx %s (wtxid=%s) cannot spend from non-version=3 tx %s (wtxid=%s)",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(),
                             entry->GetSharedTx()->GetHash().ToString(), entry->GetSharedTx()->GetWitnessHash().ToString()),
                nullptr);
        }
    }

    // This function is specialized for these limits, and must be reimplemented if they ever change.
    static_assert(TRUC_ANCESTOR_LIMIT == 2);
    static_assert(TRUC_DESCENDANT_LIMIT == 2);

    // The rest of the rules only apply to transactions with version=3.
    if (ptx->version != TRUC_VERSION) return std::nullopt;

    if (vsize > TRUC_MAX_VSIZE) {
        return std::make_pair(strprintf("version=3 tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                         ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_MAX_VSIZE),
            nullptr);
    }

    // Check that TRUC_ANCESTOR_LIMIT would not be violated.
    if (mempool_ancestors.size() + 1 > TRUC_ANCESTOR_LIMIT) {
        return std::make_pair(strprintf("tx %s (wtxid=%s) would have too many ancestors",
                         ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString()),
            nullptr);
    }

    // Remaining checks only pertain to transactions with unconfirmed ancestors.
    if (mempool_ancestors.size() > 0) {
        // If this transaction spends TRUC parents, it cannot be too large.
        if (vsize > TRUC_CHILD_MAX_VSIZE) {
            return std::make_pair(strprintf("version=3 child tx %s (wtxid=%s) is too big: %u > %u virtual bytes",
                             ptx->GetHash().ToString(), ptx->GetWitnessHash().ToString(), vsize, TRUC_CHILD_MAX_VSIZE),
                nullptr);
        }

        // Check the descendant counts of in-mempool ancestors.
        const auto& parent_entry = *mempool_ancestors.begin();
        // If there are any ancestors, this is the only child allowed. The parent cannot have any
        // other descendants. We handle the possibility of multiple children as that case is
        // possible through a reorg.
        const auto& children = parent_entry->GetMemPoolChildrenConst();
        // Don't double-count a transaction that is going to be replaced. This logic assumes that
        // any descendant of the TRUC transaction is a direct child, which makes sense because a
        // TRUC transaction can only have 1 descendant.
        const bool child_will_be_replaced = !children.empty() &&
            std::any_of(children.cbegin(), children.cend(),
                [&direct_conflicts](const CTxMemPoolEntry& child){return direct_conflicts.count(child.GetTx().GetHash()) > 0;});
        if (parent_entry->GetCountWithDescendants() + 1 > TRUC_DESCENDANT_LIMIT && !child_will_be_replaced) {
            // Allow sibling eviction for TRUC transaction: if another child already exists, even if
            // we don't conflict inputs with it, consider evicting it under RBF rules. We rely on TRUC rules
            // only permitting 1 descendant, as otherwise we would need to have logic for deciding
            // which descendant to evict. Skip if this isn't true, e.g. if the transaction has
            // multiple children or the sibling also has descendants due to a reorg.
            const bool consider_sibling_eviction{parent_entry->GetCountWithDescendants() == 2 &&
                children.begin()->get().GetCountWithAncestors() == 2};

            // Return the sibling if its eviction can be considered. Provide the "descendant count
            // limit" string either way, as the caller may decide not to do sibling eviction.
            return std::make_pair(strprintf("tx %u (wtxid=%s) would exceed descendant count limit",
                                            parent_entry->GetSharedTx()->GetHash().ToString(),
                                            parent_entry->GetSharedTx()->GetWitnessHash().ToString()),
                                  consider_sibling_eviction ?  children.begin()->get().GetSharedTx() : nullptr);
        }
    }
    return std::nullopt;
}